

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Set_block_cyclic_proc_grid64(int g_a,int64_t *block,int64_t *proc_grid)

{
  long lVar1;
  long lVar2;
  Integer _proc_grid [7];
  Integer _block [7];
  Integer aIStack_98 [7];
  int64_t iStack_60;
  Integer local_58 [8];
  
  lVar1 = pnga_get_dimension((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&iStack_60)[lVar2] = *block;
      block = block + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (0 < lVar1) {
    do {
      aIStack_98[lVar1 + -1] = *proc_grid;
      proc_grid = proc_grid + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  pnga_set_block_cyclic_proc_grid((long)g_a,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Set_block_cyclic_proc_grid64(int g_a, int64_t block[], int64_t proc_grid[])
{
    Integer aa, ndim;
    Integer _block[MAXDIM];
    Integer _proc_grid[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_block, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);
    wnga_set_block_cyclic_proc_grid(aa, _block, _proc_grid);
}